

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall
TaprootUtil_CreateTapScriptControl_Elements_Test::~TaprootUtil_CreateTapScriptControl_Elements_Test
          (TaprootUtil_CreateTapScriptControl_Elements_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl_Elements) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  NetType net_type = NetType::kElementsRegtest;
  TaprootScriptTree tree(redeem_script, net_type);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  Address addr01(net_type, WitnessVersion::kVersion1, pk0, GetElementsAddressFormatList());
  EXPECT_EQ("ert1pugx48kntvdtm5vlr967s5wahgeu0889zwxgle0zn6tk39fp00zwqt6xq6r", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("5120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c", addr01.GetLockingScript().GetHex());

  ConfidentialTransaction tx1(2, 0);
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  tx1.AddTxIn(
      Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"),
      0, 0xffffffff);  // ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0
  Amount amt0(int64_t{2500000000});
  ConfidentialValue val0(amt0);
  Amount amt1(int64_t{2499999000});
  ConfidentialValue val1(amt1);
  tx1.AddTxOut(amt1, asset, locking_script);
  Amount fee1(int64_t{1000});
  tx1.AddTxOutFee(fee1, asset);
  EXPECT_EQ("020000000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetElementsSignatureHash(0, pkh_script1.GetData(),
        sighash_type, val0, WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51800225120e20d53da6b6357ba33e32ebd0a3bb74678f39ca27191fcbc53d2ed12a42f789c0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000247304402204846079d356c76f5c59312b911d4096777aa40c06ffd77dc6836f85b42c1816702201f0df4a850234c82b1fb9c068a96a620d2038419e100eec9b6cff3f377a786130121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000", tx1.GetHex());
  
  BlockHash genesis_block_hash("cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338");
  ConfidentialTransaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0", GetElementsAddressFormatList());
  Amount amt2(int64_t{2499998000});
  ConfidentialValue val2(amt2);
  tx2.AddTxOut(amt2, asset, addr2.GetLockingScript());
  Amount fee2(int64_t{1000});
  tx1.AddTxOutFee(fee2, asset);
  std::vector<ConfidentialTxOut> utxo_list(1);
  utxo_list[0] = ConfidentialTxOut(locking_script, asset, val1);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetElementsSchnorrSignatureHash(
    0, sighash_type, genesis_block_hash, utxo_list, &script_data);
  EXPECT_EQ("10ea5c82c50a85cce83931825bf181c99638e3412e7a0e0f438a4b11485174e8", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb6", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("0200000001019923e6194a15c93658fb458cd38a4fe5326e45298b6dcf9184a022e352bc1c4b0000000000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000341ef2478577df06c2e4b78595d223e8c9be032b8dd49818516d66101bcba32a710cd20b85f2a2299094b00c1289ac42c7fee22db7b9eb3199de711d7b96b094cb60122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c51777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}